

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<int,_ProString>::insert(QMultiMap<int,_ProString> *this,int *key,ProString *value)

{
  bool bVar1;
  QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
  *pQVar2;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  iterator i;
  QMultiMap<int,_ProString> copy;
  iterator in_stack_ffffffffffffff58;
  QMultiMap<int,_ProString> *in_stack_ffffffffffffff60;
  pair<const_int,_ProString> *this_00;
  _Rb_tree_const_iterator<std::pair<const_int,_ProString>_> local_28;
  iterator local_20;
  undefined8 local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff60->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffff60,
              (QMultiMap<int,_ProString> *)in_stack_ffffffffffffff58._M_node);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<int,_ProString> *)0x2c81b4);
  }
  detach(in_stack_ffffffffffffff60);
  local_20._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>_>
                *)0x2c81da);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>::
       lower_bound(in_stack_ffffffffffffff58._M_node,(key_type *)0x2c81eb);
  pQVar2 = QtPrivate::
           QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>_>
           ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>_>
                         *)0x2c81fd);
  this_00 = (pair<const_int,_ProString> *)&pQVar2->m;
  std::_Rb_tree_const_iterator<std::pair<const_int,_ProString>_>::_Rb_tree_const_iterator
            (&local_28,&local_20);
  std::pair<const_int,_ProString>::pair<const_int,_ProString,_true>
            (this_00,(int *)in_stack_ffffffffffffff58._M_node,(ProString *)0x2c8234);
  std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>::
  insert((multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>
          *)this_00,in_RDI,(value_type *)in_stack_ffffffffffffff58._M_node);
  iterator::iterator((iterator *)0x2c8262,in_stack_ffffffffffffff58);
  std::pair<const_int,_ProString>::~pair((pair<const_int,_ProString> *)0x2c826c);
  ~QMultiMap((QMultiMap<int,_ProString> *)0x2c8279);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }